

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.h
# Opt level: O1

void __thiscall leveldb::SnapshotList::Delete(SnapshotList *this,SnapshotImpl *snapshot)

{
  SnapshotImpl *pSVar1;
  
  if (snapshot->list_ != this) {
    __assert_fail("snapshot->list_ == this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/snapshot.h"
                  ,0x51,"void leveldb::SnapshotList::Delete(const SnapshotImpl *)");
  }
  pSVar1 = snapshot->prev_;
  pSVar1->next_ = snapshot->next_;
  snapshot->next_->prev_ = pSVar1;
  if (snapshot != (SnapshotImpl *)0x0) {
    (*(snapshot->super_Snapshot)._vptr_Snapshot[1])(snapshot);
    return;
  }
  return;
}

Assistant:

void Delete(const SnapshotImpl* snapshot) {
#if !defined(NDEBUG)
    assert(snapshot->list_ == this);
#endif  // !defined(NDEBUG)
    snapshot->prev_->next_ = snapshot->next_;
    snapshot->next_->prev_ = snapshot->prev_;
    delete snapshot;
  }